

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_decl.hpp
# Opt level: O0

double __thiscall units::detail::power_const<double>(detail *this,double val,int power)

{
  int power_00;
  double dVar1;
  double local_48;
  double local_40;
  double local_30;
  double local_28;
  int power_local;
  double val_local;
  
  power_00 = (int)this;
  if (power_00 < 2) {
    if (power_00 < -1) {
      dVar1 = power_const<double>((detail *)((long)-power_00 / 2 & 0xffffffff),val,power);
      dVar1 = sqr_power<double>(dVar1);
      local_40 = val;
      if (-power_00 % 2 == 0) {
        local_40 = 1.0;
      }
      local_48 = 1.0 / (dVar1 * local_40);
    }
    else {
      local_48 = power_const_small<double>(val,power_00);
    }
    local_30 = local_48;
  }
  else {
    dVar1 = power_const<double>((detail *)((long)power_00 / 2 & 0xffffffff),val,power);
    local_30 = sqr_power<double>(dVar1);
    local_28 = val;
    if (power_00 % 2 == 0) {
      local_28 = 1.0;
    }
    local_30 = local_30 * local_28;
  }
  return local_30;
}

Assistant:

constexpr X power_const(X val, int power)
    {
        return (power > 1) ? sqr_power(power_const(val, power / 2)) *
                (power % 2 == 0 ? X{1.0} : val) :
            (power < -1) ? X{1.0} /
                (sqr_power(power_const(val, (-power) / 2)) *
                 ((-power) % 2 == 0 ? X{1.0} : val)) :
                           power_const_small(val, power);
    }